

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O0

UChar * u_uastrcpy_63(UChar *ucs1,char *s2)

{
  char *src;
  char *dest;
  UBool UVar1;
  UConverter *cnv_00;
  size_t sVar2;
  UConverter *cnv;
  char *pcStack_18;
  UErrorCode err;
  char *s2_local;
  UChar *ucs1_local;
  
  cnv._4_4_ = U_ZERO_ERROR;
  pcStack_18 = s2;
  s2_local = (char *)ucs1;
  cnv_00 = u_getDefaultConverter_63((UErrorCode *)((long)&cnv + 4));
  UVar1 = U_SUCCESS(cnv._4_4_);
  dest = s2_local;
  src = pcStack_18;
  if ((UVar1 == '\0') || (cnv_00 == (UConverter *)0x0)) {
    s2_local[0] = '\0';
    s2_local[1] = '\0';
  }
  else {
    sVar2 = strlen(pcStack_18);
    ucnv_toUChars_63(cnv_00,(UChar *)dest,0xfffffff,src,(int32_t)sVar2,
                     (UErrorCode *)((long)&cnv + 4));
    u_releaseDefaultConverter_63(cnv_00);
    UVar1 = U_FAILURE(cnv._4_4_);
    if (UVar1 != '\0') {
      s2_local[0] = '\0';
      s2_local[1] = '\0';
    }
  }
  return (UChar *)s2_local;
}

Assistant:

U_CAPI UChar*  U_EXPORT2
u_uastrcpy(UChar *ucs1,
          const char *s2 )
{
  UErrorCode err = U_ZERO_ERROR;
  UConverter *cnv = u_getDefaultConverter(&err);
  if(U_SUCCESS(err) && cnv != NULL) {
    ucnv_toUChars(cnv,
                    ucs1,
                    MAX_STRLEN,
                    s2,
                    (int32_t)uprv_strlen(s2),
                    &err);
    u_releaseDefaultConverter(cnv);
    if(U_FAILURE(err)) {
      *ucs1 = 0;
    }
  } else {
    *ucs1 = 0;
  }
  return ucs1;
}